

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O1

void __thiscall
Vgm_Emu_Impl::update_fm_rates(Vgm_Emu_Impl *this,long *ym2413_rate,long *ym2612_rate)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  
  for (pbVar1 = this->data + 0x40; pbVar1 < this->data_end; pbVar1 = pbVar1 + uVar2) {
    bVar3 = *pbVar1;
    uVar2 = 2;
    switch(bVar3) {
    case 0x61:
      uVar2 = 3;
      break;
    case 0x62:
    case 99:
    case 0x65:
switchD_00582431_caseD_62:
      bVar3 = (bVar3 >> 4) - 3;
      uVar2 = 1;
      if (bVar3 < 0xd) {
        uVar2 = *(ulong *)(&DAT_00633d30 + (ulong)bVar3 * 8);
      }
      break;
    case 100:
      break;
    case 0x66:
      goto switchD_00582431_caseD_66;
    case 0x67:
      uVar2 = (ulong)(*(int *)(pbVar1 + 3) + 7);
      break;
    default:
      switch(bVar3) {
      case 0x50:
        goto switchD_00582431_caseD_64;
      case 0x52:
      case 0x53:
        *ym2612_rate = *ym2413_rate;
        ym2612_rate = ym2413_rate;
        break;
      case 0x54:
        *ym2413_rate = 0;
      case 0x51:
        break;
      default:
        goto switchD_00582431_caseD_62;
      }
      *ym2612_rate = 0;
      goto switchD_00582431_caseD_66;
    }
switchD_00582431_caseD_64:
  }
switchD_00582431_caseD_66:
  return;
}

Assistant:

void Vgm_Emu_Impl::update_fm_rates( long* ym2413_rate, long* ym2612_rate ) const
{
	byte const* p = data + 0x40;
	while ( p < data_end )
	{
		switch ( *p )
		{
		case cmd_end:
			return;
		
		case cmd_psg:
		case cmd_byte_delay:
			p += 2;
			break;
		
		case cmd_delay:
			p += 3;
			break;
		
		case cmd_data_block:
			p += 7 + get_le32( p + 3 );
			break;
		
		case cmd_ym2413:
			*ym2612_rate = 0;
			return;
		
		case cmd_ym2612_port0:
		case cmd_ym2612_port1:
			*ym2612_rate = *ym2413_rate;
			*ym2413_rate = 0;
			return;
		
		case cmd_ym2151:
			*ym2413_rate = 0;
			*ym2612_rate = 0;
			return;
		
		default:
			p += command_len( *p );
		}
	}
}